

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O0

void __thiscall
depspawn::internal::TaskPool::TaskPool
          (TaskPool *this,int nthreads,int avg_max_tasks_per_thread,bool launch)

{
  int iVar1;
  int iVar2;
  byte in_CL;
  int in_EDX;
  ThreadPool *in_RDI;
  __integral_type_conflict in_stack_ffffffffffffff7c;
  atomic<int> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  TaskPool *this_00;
  ThreadPool *this_01;
  pointer *n;
  queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>
  *in_stack_ffffffffffffffc0;
  
  this_01 = in_RDI;
  ThreadPool::ThreadPool(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  iVar1 = ThreadPool::nthreads(this_01);
  iVar2 = ThreadPool::nthreads(this_01);
  this_01[1].threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(long)(int)(iVar1 * in_EDX + (uint)(iVar2 == 0));
  n = &this_01[1].threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
       super__Vector_impl_data._M_finish;
  boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>
  ::queue(in_stack_ffffffffffffffc0,(size_type)n);
  this_00 = (TaskPool *)(in_RDI + 2);
  boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>
  ::queue(in_stack_ffffffffffffffc0,(size_type)n);
  iVar2 = (int)((ulong)n >> 0x20);
  iVar1 = ThreadPool::nthreads(in_RDI);
  ThreadPool::nthreads(in_RDI);
  LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::LinkedListPool
            ((LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)
             in_stack_ffffffffffffffc0,iVar2,(size_t)this_01);
  in_RDI[3].mutex_.super___mutex_base._M_mutex.__size[0x10] = '\x01';
  std::atomic<int>::atomic(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  std::function<void_()>::function
            ((function<void_()> *)&in_RDI[3].mutex_.super___mutex_base._M_mutex.__data.__list);
  ThreadPool::set_function<void(depspawn::internal::TaskPool::*)(),depspawn::internal::TaskPool*>
            (in_RDI,(offset_in_TaskPool_to_subr *)this_00,
             (TaskPool **)CONCAT44(iVar1,in_stack_ffffffffffffff90));
  if ((in_CL & 1) != 0) {
    launch_threads(this_00);
  }
  return;
}

Assistant:

TaskPool(const int nthreads, const int avg_max_tasks_per_thread = Default_Max_Tasks_Per_Thread, const bool launch = true) :
  thread_pool_{nthreads},
  queue_size_{static_cast<size_t>(thread_pool_.nthreads() * avg_max_tasks_per_thread + !thread_pool_.nthreads())},
  queue_{queue_size_},
  hp_queue_{queue_size_},
  task_pool_{thread_pool_.nthreads() * Default_Max_Tasks_Per_Thread + !thread_pool_.nthreads()},
  finish_{true},
  busy_threads_{0}
  {
    thread_pool_.set_function(&TaskPool::main, this);

    if(launch) {
      launch_threads();
    }
  }